

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlareState.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::FlareState::FlareState
          (FlareState *this,KUINT8 Index,KUINT32 TimeSinceCreation,EntityType *MunitionSource,
          KUINT32 NumberIntensity,KUINT32 NumberOfSources,KUINT16 GeometryIndex)

{
  KUINT32 NumberOfSources_local;
  KUINT32 NumberIntensity_local;
  EntityType *MunitionSource_local;
  KUINT32 TimeSinceCreation_local;
  KUINT8 Index_local;
  FlareState *this_local;
  
  EnvironmentRecord::EnvironmentRecord(&this->super_EnvironmentRecord);
  (this->super_EnvironmentRecord).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__FlareState_0032e178;
  this->m_ui32TSC = TimeSinceCreation;
  EntityType::EntityType(&this->m_Src,MunitionSource);
  this->m_ui32NumInt = NumberIntensity;
  this->m_ui32NumSrcs = NumberOfSources;
  this->m_ui16GeometryIndex = GeometryIndex;
  this->m_ui16Padding = 0;
  (this->super_EnvironmentRecord).m_ui8Index = Index;
  (this->super_EnvironmentRecord).m_ui32EnvRecTyp = 0x103;
  (this->super_EnvironmentRecord).m_ui16Length = 0x100;
  return;
}

Assistant:

FlareState::FlareState( KUINT8 Index, KUINT32 TimeSinceCreation, const EntityType & MunitionSource,
                        KUINT32 NumberIntensity, KUINT32 NumberOfSources, KUINT16 GeometryIndex ) :
    m_ui32TSC( TimeSinceCreation ),
    m_Src( MunitionSource ),
    m_ui32NumInt( NumberIntensity ),
    m_ui32NumSrcs( NumberOfSources ),
    m_ui16GeometryIndex( GeometryIndex ),
    m_ui16Padding( 0 )
{
    m_ui8Index = Index;
    m_ui32EnvRecTyp = FlareStateType;
    m_ui16Length = FLARE_STATE_SIZE * 8;
}